

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::analyze_argument_buffers(CompilerMSL *this)

{
  char *pcVar1;
  ID *this_00;
  ulong uVar2;
  Resource *pRVar3;
  size_t sVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  ID IVar8;
  uint uVar9;
  long lVar10;
  SPIRVariable *pSVar11;
  mapped_type *pmVar12;
  size_type sVar13;
  size_type sVar14;
  bool *pbVar15;
  SPIRType *pSVar16;
  undefined4 extraout_var;
  SPIRType *pSVar17;
  SPIRType *this_01;
  size_type sVar18;
  mapped_type *pmVar19;
  AlignedBuffer<Resource,_8UL> *pAVar20;
  uint *ts_1;
  string *ts_1_00;
  uint32_t i;
  Resource *pRVar21;
  CompilerMSL *this_02;
  SmallVector<Resource,_8UL> *pSVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  CompilerMSL *pCVar23;
  TypedID<(spirv_cross::Types)0> *pTVar24;
  long lVar25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts;
  byte bVar26;
  undefined7 local_1188;
  bool needs_buffer_sizes;
  SPIRType *local_1180;
  uint local_1174;
  CompilerMSL *local_1170;
  SPIRVariable *local_1168;
  SPIRType *local_1160;
  SPIRType *local_1158;
  undefined8 local_1150;
  ParsedIR *local_1148;
  spirv_cross *local_1140;
  SmallVector<Resource,_8UL> *local_1138;
  uint32_t uint_ptr_type_id;
  uint32_t var_id;
  uint32_t ptr_type_id;
  map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
  *local_10e8;
  SetBindingPair pair;
  bool set_needs_buffer_sizes [8];
  bool set_needs_swizzle_buffer [8];
  SPIRType uint_type_pointer;
  SmallVector<unsigned_int,_8UL> inline_block_vars;
  string local_f38;
  string local_f18;
  SmallVector<Resource,_8UL> resources_in_set [8];
  
  bVar26 = 0;
  for (lVar10 = 0x2ad8; lVar10 != 11000; lVar10 = lVar10 + 4) {
    pcVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.stack_storage.aligned_char +
             lVar10 + -0x40;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
  }
  lVar10 = 0xec0;
  pAVar20 = &resources_in_set[0].stack_storage;
  do {
    *(undefined8 *)((long)(pAVar20 + -1) + 0x1b0) = 0;
    *(AlignedBuffer<Resource,_8UL> **)((long)(pAVar20 + -1) + 0x1a8) = pAVar20;
    *(undefined8 *)((long)(pAVar20 + -1) + 0x1b8) = 8;
    pAVar20 = (AlignedBuffer<Resource,_8UL> *)((long)(pAVar20 + 1) + 0x18);
    lVar10 = lVar10 + -0x1d8;
  } while (lVar10 != 0);
  inline_block_vars.super_VectorView<unsigned_int>.ptr = (uint *)&inline_block_vars.stack_storage;
  inline_block_vars.super_VectorView<unsigned_int>.buffer_size = 0;
  set_needs_swizzle_buffer[0] = false;
  set_needs_swizzle_buffer[1] = false;
  set_needs_swizzle_buffer[2] = false;
  set_needs_swizzle_buffer[3] = false;
  set_needs_swizzle_buffer[4] = false;
  set_needs_swizzle_buffer[5] = false;
  set_needs_swizzle_buffer[6] = false;
  set_needs_swizzle_buffer[7] = false;
  set_needs_buffer_sizes[0] = false;
  set_needs_buffer_sizes[1] = false;
  set_needs_buffer_sizes[2] = false;
  set_needs_buffer_sizes[3] = false;
  set_needs_buffer_sizes[4] = false;
  set_needs_buffer_sizes[5] = false;
  set_needs_buffer_sizes[6] = false;
  set_needs_buffer_sizes[7] = false;
  inline_block_vars.buffer_capacity = 8;
  needs_buffer_sizes = false;
  local_1148 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(local_1148);
  pTVar24 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  local_1168 = (SPIRVariable *)
               (pTVar24 +
               (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size);
  local_10e8 = &this->constexpr_samplers_by_id;
  local_1170 = (CompilerMSL *)&this->buffers_requiring_array_length;
  do {
    if ((SPIRVariable *)pTVar24 == local_1168) {
      ParsedIR::LoopLock::~LoopLock((LoopLock *)&uint_ptr_type_id);
      local_1170 = this;
      if ((this->needs_swizzle_buffer_def != false) || (needs_buffer_sizes == true)) {
        uint_ptr_type_id = 0;
        pSVar22 = resources_in_set;
        for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
          bVar5 = set_needs_swizzle_buffer[lVar10];
          if ((bVar5 != false) || (set_needs_buffer_sizes[lVar10] == true)) {
            if (uint_ptr_type_id == 0) {
              uint_ptr_type_id = ParsedIR::increase_bound_by(local_1148,1);
              pSVar16 = get_uint_type(local_1170);
              SPIRType::SPIRType(&uint_type_pointer,pSVar16);
              pCVar23 = local_1170;
              uint_type_pointer.pointer = true;
              uint_type_pointer.pointer_depth = 1;
              uint_type_pointer.parent_type.id = get_uint_type_id(local_1170);
              uint_type_pointer.storage = StorageClassUniform;
              Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                        ((Compiler *)pCVar23,uint_ptr_type_id,&uint_type_pointer);
              Compiler::set_decoration
                        ((Compiler *)pCVar23,(ID)uint_ptr_type_id,DecorationArrayStride,4);
              SPIRType::~SPIRType(&uint_type_pointer);
            }
            if (bVar5 != false) {
              IVar8.id = ParsedIR::increase_bound_by(local_1148,1);
              uint_type_pointer.super_IVariant._vptr_IVariant =
                   (_func_int **)
                   ((ulong)uint_type_pointer.super_IVariant._vptr_IVariant & 0xffffffff00000000);
              pSVar11 = Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                                  ((Compiler *)local_1170,IVar8.id,&uint_ptr_type_id,
                                   (StorageClass *)&uint_type_pointer);
              ::std::__cxx11::string::string
                        ((string *)&uint_type_pointer,"spvSwizzleConstants",(allocator *)&var_id);
              pCVar23 = local_1170;
              Compiler::set_name((Compiler *)local_1170,IVar8,(string *)&uint_type_pointer);
              ::std::__cxx11::string::~string((string *)&uint_type_pointer);
              Compiler::set_decoration
                        ((Compiler *)pCVar23,IVar8,DecorationDescriptorSet,(uint32_t)lVar10);
              Compiler::set_decoration((Compiler *)pCVar23,IVar8,DecorationBinding,0xfffffffe);
              uint_type_pointer.super_IVariant._vptr_IVariant = (_func_int **)pSVar11;
              (*(pCVar23->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&uint_type_pointer.super_IVariant.self,pCVar23,(ulong)IVar8.id);
              uint_type_pointer.array.super_VectorView<unsigned_int>.buffer_size._0_4_ = UInt;
              uint_type_pointer.array.super_VectorView<unsigned_int>.buffer_size._4_4_ =
                   get_metal_resource_index(pCVar23,pSVar11,UInt,0);
              uint_type_pointer.array.buffer_capacity._0_4_ = 0;
              SmallVector<Resource,_8UL>::push_back(pSVar22,(Resource *)&uint_type_pointer);
              ::std::__cxx11::string::~string((string *)&uint_type_pointer.super_IVariant.self);
            }
            if (set_needs_buffer_sizes[lVar10] == true) {
              IVar8.id = ParsedIR::increase_bound_by(local_1148,1);
              uint_type_pointer.super_IVariant._vptr_IVariant =
                   (_func_int **)
                   ((ulong)uint_type_pointer.super_IVariant._vptr_IVariant & 0xffffffff00000000);
              pSVar11 = Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                                  ((Compiler *)local_1170,IVar8.id,&uint_ptr_type_id,
                                   (StorageClass *)&uint_type_pointer);
              ::std::__cxx11::string::string
                        ((string *)&uint_type_pointer,"spvBufferSizeConstants",(allocator *)&var_id)
              ;
              pCVar23 = local_1170;
              Compiler::set_name((Compiler *)local_1170,IVar8,(string *)&uint_type_pointer);
              ::std::__cxx11::string::~string((string *)&uint_type_pointer);
              Compiler::set_decoration
                        ((Compiler *)pCVar23,IVar8,DecorationDescriptorSet,(uint32_t)lVar10);
              Compiler::set_decoration((Compiler *)pCVar23,IVar8,DecorationBinding,0xfffffffd);
              uint_type_pointer.super_IVariant._vptr_IVariant = (_func_int **)pSVar11;
              (*(pCVar23->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&uint_type_pointer.super_IVariant.self,pCVar23,(ulong)IVar8.id);
              uint_type_pointer.array.super_VectorView<unsigned_int>.buffer_size._0_4_ = UInt;
              uint_type_pointer.array.super_VectorView<unsigned_int>.buffer_size._4_4_ =
                   get_metal_resource_index(pCVar23,pSVar11,UInt,0);
              uint_type_pointer.array.buffer_capacity._0_4_ = 0;
              SmallVector<Resource,_8UL>::push_back(pSVar22,(Resource *)&uint_type_pointer);
              ::std::__cxx11::string::~string((string *)&uint_type_pointer.super_IVariant.self);
            }
          }
          pSVar22 = pSVar22 + 1;
        }
      }
      pCVar23 = local_1170;
      local_1168 = (SPIRVariable *)inline_block_vars.super_VectorView<unsigned_int>.ptr;
      lVar10 = inline_block_vars.super_VectorView<unsigned_int>.buffer_size << 2;
      for (lVar25 = 0; lVar10 != lVar25; lVar25 = lVar25 + 4) {
        IVar8.id = *(uint32_t *)
                    ((long)(&(local_1168->dereference_chain).stack_storage + -2) + 8 + lVar25);
        pSVar11 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)pCVar23,IVar8.id);
        uVar6 = Compiler::get_decoration((Compiler *)pCVar23,IVar8,DecorationDescriptorSet);
        CompilerGLSL::add_resource_name(&pCVar23->super_CompilerGLSL,IVar8.id);
        uint_type_pointer.super_IVariant._vptr_IVariant = (_func_int **)pSVar11;
        (*(pCVar23->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&uint_type_pointer.super_IVariant.self,pCVar23,(ulong)IVar8.id);
        uint_type_pointer.array.super_VectorView<unsigned_int>.buffer_size._0_4_ = Struct;
        uint_type_pointer.array.super_VectorView<unsigned_int>.buffer_size._4_4_ =
             get_metal_resource_index(pCVar23,pSVar11,Struct,0);
        uint_type_pointer.array.buffer_capacity._0_4_ = 0;
        SmallVector<Resource,_8UL>::push_back
                  ((SmallVector<Resource,_8UL> *)&resources_in_set[uVar6].super_VectorView<Resource>
                   ,(Resource *)&uint_type_pointer);
        ::std::__cxx11::string::~string((string *)&uint_type_pointer.super_IVariant.self);
      }
      local_1140 = (spirv_cross *)&local_1170->plane_name_suffix;
      local_10e8 = (map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
                    *)&local_1170->buffers_requiring_dynamic_offset;
      uVar9 = 0;
      pCVar23 = local_1170;
      do {
        local_1174 = uVar9;
        if (7 < uVar9) {
          SmallVector<unsigned_int,_8UL>::~SmallVector(&inline_block_vars);
          lVar10 = 0xce8;
          do {
            SmallVector<Resource,_8UL>::~SmallVector
                      ((SmallVector<Resource,_8UL> *)
                       (resources_in_set[0].stack_storage.aligned_char + lVar10 + -0x18));
            lVar10 = lVar10 + -0x1d8;
          } while (lVar10 != -0x1d8);
          return;
        }
        if (resources_in_set[uVar9].super_VectorView<Resource>.buffer_size != 0) {
          if (((pCVar23->msl_options).argument_buffers != true) ||
             ((pCVar23->argument_buffer_discrete_mask >> (uVar9 & 0x1f) & 1) != 0)) {
            __assert_fail("descriptor_set_is_argument_buffer(desc_set)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                          ,0x350d,"void spirv_cross::CompilerMSL::analyze_argument_buffers()");
          }
          uVar6 = ParsedIR::increase_bound_by(local_1148,3);
          local_1150 = CONCAT44(extraout_var,uVar6);
          IVar8.id = uVar6 + 1;
          ptr_type_id = uVar6 + 2;
          pCVar23->argument_buffer_ids[local_1174] = uVar6;
          local_1180 = Compiler::set<spirv_cross::SPIRType>((Compiler *)pCVar23,IVar8.id);
          *(undefined4 *)&(local_1180->super_IVariant).field_0xc = 0xf;
          ts_1 = (uint *)(ulong)local_1174;
          local_1158 = local_1180;
          if ((pCVar23->argument_buffer_device_storage_mask >> (local_1174 & 0x1f) & 1) == 0) {
            local_1180->storage = StorageClassUniform;
          }
          else {
            local_1180->storage = StorageClassStorageBuffer;
            Compiler::set_decoration
                      ((Compiler *)pCVar23,(ID)(uint32_t)local_1150,DecorationNonWritable,0);
            ts_1 = (uint *)0x0;
            Compiler::set_decoration((Compiler *)pCVar23,IVar8,DecorationBlock,0);
          }
          join<char_const(&)[23],unsigned_int&>
                    ((string *)&uint_type_pointer,(spirv_cross *)"spvDescriptorSetBuffer",
                     (char (*) [23])&local_1174,ts_1);
          Compiler::set_name((Compiler *)pCVar23,IVar8,(string *)&uint_type_pointer);
          ::std::__cxx11::string::~string((string *)&uint_type_pointer);
          pSVar16 = Compiler::set<spirv_cross::SPIRType>((Compiler *)pCVar23,ptr_type_id);
          SPIRType::operator=(pSVar16,local_1158);
          pSVar16->pointer = true;
          pSVar16->pointer_depth = 1;
          (pSVar16->parent_type).id = IVar8.id;
          uint_type_pointer.super_IVariant._vptr_IVariant =
               (_func_int **)CONCAT44(uint_type_pointer.super_IVariant._vptr_IVariant._4_4_,2);
          pSVar16 = &uint_type_pointer;
          Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                    ((Compiler *)pCVar23,(uint32_t)local_1150,&ptr_type_id,
                     (StorageClass *)&uint_type_pointer);
          join<char_const(&)[17],unsigned_int&>
                    ((string *)&uint_type_pointer,(spirv_cross *)"spvDescriptorSet",
                     (char (*) [17])&local_1174,(uint *)pSVar16);
          Compiler::set_name((Compiler *)pCVar23,(ID)(uint32_t)local_1150,
                             (string *)&uint_type_pointer);
          ::std::__cxx11::string::~string((string *)&uint_type_pointer);
          uVar2 = resources_in_set[uVar9].super_VectorView<Resource>.buffer_size;
          if (uVar2 != 0) {
            pRVar3 = resources_in_set[uVar9].super_VectorView<Resource>.ptr;
            lVar10 = 0x3f;
            if (uVar2 != 0) {
              for (; uVar2 >> lVar10 == 0; lVar10 = lVar10 + -1) {
              }
            }
            ::std::
            __introsort_loop<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource*,long,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::analyze_argument_buffers()::__1>>
                      (pRVar3,pRVar3 + uVar2,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
            if ((long)uVar2 < 0x11) {
              ::std::
              __insertion_sort<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::analyze_argument_buffers()::__1>>
                        (pRVar3,pRVar3 + uVar2);
            }
            else {
              pRVar21 = pRVar3 + 0x10;
              ::std::
              __insertion_sort<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::analyze_argument_buffers()::__1>>
                        (pRVar3,pRVar21);
              for (lVar10 = uVar2 * 0x38 + -0x380; lVar10 != 0; lVar10 = lVar10 + -0x38) {
                ::std::
                __unguarded_linear_insert<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource*,__gnu_cxx::__ops::_Val_comp_iter<spirv_cross::CompilerMSL::analyze_argument_buffers()::__1>>
                          (pRVar21);
                pRVar21 = pRVar21 + 1;
              }
            }
          }
          local_1180 = (SPIRType *)&local_1180->member_types;
          ts = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(resources_in_set[uVar9].super_VectorView<Resource>.ptr)->plane;
          local_1138 = (SmallVector<Resource,_8UL> *)((ulong)local_1138 & 0xffffffff00000000);
          pSVar16 = (SPIRType *)
                    (resources_in_set[uVar9].super_VectorView<Resource>.buffer_size * 0x38);
          pCVar23 = local_1170;
          while (pSVar16 != (SPIRType *)0x0) {
            local_1168 = (SPIRVariable *)ts[-2].field_2._M_allocated_capacity;
            local_1160 = pSVar16;
            pSVar16 = Compiler::get_variable_data_type((Compiler *)pCVar23,local_1168);
            ::std::__cxx11::string::string
                      ((string *)&local_f38,(string *)(ts[-2].field_2._M_local_buf + 8));
            this_02 = (CompilerMSL *)0x31c63e;
            ::std::__cxx11::string::string((string *)&local_f18,"m",(allocator *)&uint_ptr_type_id);
            ts_1_00 = &local_f18;
            ensure_valid_name((string *)&uint_type_pointer,this_02,&local_f38,&local_f18);
            ::std::__cxx11::string::~string((string *)&local_f18);
            ::std::__cxx11::string::~string((string *)&local_f38);
            if (*(int *)&(ts->_M_dataplus)._M_p != 0) {
              join<std::__cxx11::string&,unsigned_int&>
                        ((string *)&uint_ptr_type_id,local_1140,ts,(uint *)ts_1_00);
              ::std::__cxx11::string::append((string *)&uint_type_pointer);
              ::std::__cxx11::string::~string((string *)&uint_ptr_type_id);
            }
            Compiler::set_member_name
                      ((Compiler *)pCVar23,(TypeID)(local_1158->super_IVariant).self.id,
                       (uint32_t)local_1138,(string *)&uint_type_pointer);
            if ((*(int *)((long)&ts[-1].field_2 + 8) == 0x12) &&
               (*(int *)&(pSVar16->super_IVariant).field_0xc != 0x12)) {
              sVar4 = (pSVar16->array).super_VectorView<unsigned_int>.buffer_size;
              uVar6 = ParsedIR::increase_bound_by(local_1148,2 - (sVar4 == 0));
              pSVar17 = Compiler::set<spirv_cross::SPIRType>((Compiler *)pCVar23,uVar6);
              pSVar17->storage = StorageClassUniformConstant;
              *(undefined4 *)&(pSVar17->super_IVariant).field_0xc = 0x12;
              if (sVar4 == 0) {
                uint_ptr_type_id = uVar6;
                SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                          ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                           local_1180,(TypedID<(spirv_cross::Types)1> *)&uint_ptr_type_id);
              }
              else {
                this_01 = Compiler::set<spirv_cross::SPIRType>((Compiler *)pCVar23,uVar6 + 1);
                SPIRType::operator=(this_01,pSVar17);
                SmallVector<unsigned_int,_8UL>::operator=(&this_01->array,&pSVar16->array);
                SmallVector<bool,_8UL>::operator=
                          (&this_01->array_size_literal,&pSVar16->array_size_literal);
                (this_01->parent_type).id = uVar6;
                uint_ptr_type_id = uVar6 + 1;
                SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                          ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                           local_1180,(TypedID<(spirv_cross::Types)1> *)&uint_ptr_type_id);
                pCVar23 = local_1170;
              }
            }
            else {
              pair.binding = Compiler::get_decoration
                                       ((Compiler *)pCVar23,(ID)(local_1168->super_IVariant).self.id
                                        ,DecorationBinding);
              pair.desc_set = local_1174;
              if (*(int *)((long)&ts[-1].field_2 + 8) - 0x10U < 3) {
                uint_ptr_type_id =
                     Compiler::get_variable_data_type_id((Compiler *)pCVar23,local_1168);
                SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                          ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                           local_1180,(TypedID<(spirv_cross::Types)1> *)&uint_ptr_type_id);
                if (*(int *)&(ts->_M_dataplus)._M_p == 0) {
                  uVar6 = (local_1168->super_IVariant).self.id;
                  (*(pCVar23->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                            ((spirv_cross *)&var_id,pCVar23,local_1150,1);
                  join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                            ((string *)&uint_ptr_type_id,(spirv_cross *)&var_id,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x30abe2,(char (*) [2])&uint_type_pointer,in_R8);
                  Compiler::set_qualified_name
                            ((Compiler *)pCVar23,uVar6,(string *)&uint_ptr_type_id);
LAB_0028cb45:
                  ::std::__cxx11::string::~string((string *)&uint_ptr_type_id);
                  ::std::__cxx11::string::~string((string *)&var_id);
                }
              }
              else {
                sVar18 = ::std::
                         map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                         ::count((map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                  *)local_10e8,&pair);
                pSVar11 = local_1168;
                if (sVar18 == 0) {
                  sVar13 = ::std::
                           _Hashtable<spirv_cross::SetBindingPair,_spirv_cross::SetBindingPair,_std::allocator<spirv_cross::SetBindingPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           ::count(&(this->inline_uniform_blocks)._M_h,&pair);
                  pSVar11 = local_1168;
                  if (sVar13 == 0) {
                    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                               local_1180,
                               (TypedID<(spirv_cross::Types)1> *)
                               &(local_1168->super_IVariant).field_0xc);
                    uVar6 = (pSVar11->super_IVariant).self.id;
                    if ((pSVar16->array).super_VectorView<unsigned_int>.buffer_size == 0) {
                      (*(pCVar23->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                                ((char (*) [3])&var_id,pCVar23,local_1150,1);
                      join<char_const(&)[3],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                                ((string *)&uint_ptr_type_id,(spirv_cross *)"(*",
                                 (char (*) [3])&var_id,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x30abe2,(char (*) [2])&uint_type_pointer,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x30ae46,(char (*) [2])CONCAT17(needs_buffer_sizes,local_1188));
                      Compiler::set_qualified_name
                                ((Compiler *)pCVar23,uVar6,(string *)&uint_ptr_type_id);
                    }
                    else {
                      (*(pCVar23->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                                ((spirv_cross *)&var_id,pCVar23,local_1150,1);
                      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                                ((string *)&uint_ptr_type_id,(spirv_cross *)&var_id,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x30abe2,(char (*) [2])&uint_type_pointer,in_R8);
                      Compiler::set_qualified_name
                                ((Compiler *)pCVar23,uVar6,(string *)&uint_ptr_type_id);
                    }
                  }
                  else {
                    uint_ptr_type_id =
                         Compiler::get_variable_data_type_id((Compiler *)pCVar23,local_1168);
                    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                               local_1180,(TypedID<(spirv_cross::Types)1> *)&uint_ptr_type_id);
                    uVar6 = (pSVar11->super_IVariant).self.id;
                    (*(pCVar23->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                              ((spirv_cross *)&var_id,pCVar23,local_1150,1);
                    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                              ((string *)&uint_ptr_type_id,(spirv_cross *)&var_id,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x30abe2,(char (*) [2])&uint_type_pointer,in_R8);
                    Compiler::set_qualified_name
                              ((Compiler *)pCVar23,uVar6,(string *)&uint_ptr_type_id);
                  }
                  goto LAB_0028cb45;
                }
                SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                          ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                           local_1180,
                           (TypedID<(spirv_cross::Types)1> *)&(local_1168->super_IVariant).field_0xc
                          );
                uVar6 = (pSVar11->super_IVariant).self.id;
                pmVar19 = ::std::
                          map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                          ::operator[]((map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                        *)local_10e8,&pair);
                pmVar19->second = uVar6;
              }
            }
            uVar6 = (uint32_t)local_1138;
            Compiler::set_extended_member_decoration
                      ((Compiler *)pCVar23,(local_1158->super_IVariant).self.id,(uint32_t)local_1138
                       ,SPIRVCrossDecorationResourceIndexPrimary,
                       *(uint32_t *)((long)&ts[-1].field_2 + 0xc));
            uVar9 = (local_1168->super_IVariant).self.id;
            in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (ulong)uVar9;
            Compiler::set_extended_member_decoration
                      ((Compiler *)pCVar23,(local_1158->super_IVariant).self.id,uVar6,
                       SPIRVCrossDecorationInterfaceOrigID,uVar9);
            local_1138 = (SmallVector<Resource,_8UL> *)CONCAT44(local_1138._4_4_,uVar6 + 1);
            ::std::__cxx11::string::~string((string *)&uint_type_pointer);
            ts = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&ts[1].field_2 + 8);
            pSVar16 = (SPIRType *)&local_1160[-1].member_name_cache;
          }
        }
        uVar9 = local_1174 + 1;
      } while( true );
    }
    IVar8.id = pTVar24->id;
    if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [IVar8.id].type == TypeVariable) {
      pSVar11 = ParsedIR::get<spirv_cross::SPIRVariable>(local_1148,IVar8.id);
      if (((((pSVar11->storage < (StorageClassStorageBuffer|StorageClassInput)) &&
            ((0x1005U >> (pSVar11->storage & 0x1f) & 1) != 0)) &&
           (bVar5 = Compiler::is_hidden_variable((Compiler *)this,pSVar11,false), !bVar5)) &&
          ((uVar6 = Compiler::get_decoration((Compiler *)this,IVar8,DecorationDescriptorSet),
           uVar6 < 8 && ((this->msl_options).argument_buffers != false)))) &&
         ((this->argument_buffer_discrete_mask >> (uVar6 & 0x1f) & 1) == 0)) {
        IVar8.id = (pSVar11->super_IVariant).self.id;
        var_id = IVar8.id;
        local_1160 = Compiler::get_variable_data_type((Compiler *)this,pSVar11);
        if ((*(int *)&(local_1160->super_IVariant).field_0xc - 0x11U < 2) &&
           (local_1180 = (SPIRType *)find_constexpr_sampler(this,IVar8.id),
           local_1180 != (SPIRType *)0x0)) {
          pmVar12 = ::std::
                    map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
                    ::operator[](local_10e8,&var_id);
          pSVar16 = local_1180;
          for (lVar10 = 0x19; IVar8.id = var_id, lVar10 != 0; lVar10 = lVar10 + -1) {
            pmVar12->coord = ((MSLConstexprSampler *)pSVar16)->coord;
            pSVar16 = (SPIRType *)((long)pSVar16 + (ulong)bVar26 * -8 + 4);
            pmVar12 = (mapped_type *)((long)pmVar12 + (ulong)bVar26 * -8 + 4);
          }
        }
        else {
          local_1180 = (SPIRType *)0x0;
        }
        uVar7 = Compiler::get_decoration((Compiler *)this,IVar8,DecorationBinding);
        local_1140 = (spirv_cross *)(ulong)uVar6;
        if (*(int *)&(local_1160->super_IVariant).field_0xc == 0x11) {
          CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,var_id);
          local_1158 = (SPIRType *)CONCAT44(local_1158._4_4_,1);
          if ((local_1180 != (SPIRType *)0x0) &&
             (local_1158 = (SPIRType *)CONCAT44(local_1158._4_4_,1),
             *(bool *)((long)local_1180 + 99) == true)) {
            local_1158 = (SPIRType *)
                         CONCAT44(local_1158._4_4_,*(uint32_t *)((long)local_1180 + 0x30));
          }
          local_1138 = (SmallVector<Resource,_8UL> *)
                       &resources_in_set[(long)local_1140].super_VectorView<Resource>;
          for (uVar6 = 0; (uint32_t)local_1158 != uVar6; uVar6 = uVar6 + 1) {
            uVar7 = get_metal_resource_index(this,pSVar11,Image,uVar6);
            this_00 = &uint_type_pointer.super_IVariant.self;
            uint_type_pointer.super_IVariant._vptr_IVariant = (_func_int **)pSVar11;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (this_00,this,(ulong)var_id);
            uint_type_pointer.array.super_VectorView<unsigned_int>.buffer_size._0_4_ = Image;
            uint_type_pointer.array.super_VectorView<unsigned_int>.buffer_size._4_4_ = uVar7;
            uint_type_pointer.array.buffer_capacity._0_4_ = uVar6;
            SmallVector<Resource,_8UL>::push_back(local_1138,(Resource *)&uint_type_pointer);
            ::std::__cxx11::string::~string((string *)this_00);
          }
          if ((local_1180 == (SPIRType *)0x0) && ((local_1160->image).dim != DimBuffer)) {
            uVar6 = get_metal_resource_index(this,pSVar11,Sampler,0);
            uint_type_pointer.super_IVariant._vptr_IVariant = (_func_int **)pSVar11;
            to_sampler_expression_abi_cxx11_
                      ((string *)&uint_type_pointer.super_IVariant.self,this,var_id);
            uint_type_pointer.array.super_VectorView<unsigned_int>.buffer_size._0_4_ = Sampler;
            pSVar22 = local_1138;
            uint_type_pointer.array.super_VectorView<unsigned_int>.buffer_size._4_4_ = uVar6;
LAB_0028c06c:
            uint_type_pointer.array.buffer_capacity._0_4_ = 0;
            SmallVector<Resource,_8UL>::push_back(pSVar22,(Resource *)&uint_type_pointer);
            ::std::__cxx11::string::~string((string *)&uint_type_pointer.super_IVariant.self);
          }
        }
        else {
          uint_type_pointer.super_IVariant._vptr_IVariant = (_func_int **)CONCAT44(uVar7,uVar6);
          sVar13 = ::std::
                   _Hashtable<spirv_cross::SetBindingPair,_spirv_cross::SetBindingPair,_std::allocator<spirv_cross::SetBindingPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::count(&(this->inline_uniform_blocks)._M_h,(key_type *)&uint_type_pointer);
          if (sVar13 == 0) {
            if ((local_1180 == (SPIRType *)0x0) &&
               ((((this->msl_options).platform != iOS ||
                 (*(int *)&(local_1160->super_IVariant).field_0xc != 0x10)) ||
                ((local_1160->image).sampled != 2)))) {
              CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,var_id);
              uint_type_pointer.super_IVariant._vptr_IVariant = (_func_int **)pSVar11;
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&uint_type_pointer.super_IVariant.self,this,(ulong)var_id);
              uint_type_pointer.array.super_VectorView<unsigned_int>.buffer_size._0_4_ =
                   *(BaseType *)&(local_1160->super_IVariant).field_0xc;
              uint_type_pointer.array.super_VectorView<unsigned_int>.buffer_size._4_4_ =
                   get_metal_resource_index
                             (this,pSVar11,
                              (BaseType)
                              uint_type_pointer.array.super_VectorView<unsigned_int>.buffer_size,0);
              pSVar22 = (SmallVector<Resource,_8UL> *)
                        &resources_in_set[(long)local_1140].super_VectorView<Resource>;
              goto LAB_0028c06c;
            }
          }
          else {
            SmallVector<unsigned_int,_8UL>::push_back(&inline_block_vars,&var_id);
          }
        }
        if ((this->needs_swizzle_buffer_def == true) &&
           (bVar5 = Compiler::is_sampled_image_type((Compiler *)this,local_1160), bVar5)) {
          pbVar15 = set_needs_swizzle_buffer + (long)local_1140;
        }
        else {
          sVar14 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)local_1170,&var_id);
          if (sVar14 == 0) goto LAB_0028c107;
          set_needs_buffer_sizes[(long)local_1140] = true;
          pbVar15 = &needs_buffer_sizes;
        }
        *pbVar15 = true;
      }
    }
LAB_0028c107:
    pTVar24 = pTVar24 + 1;
  } while( true );
}

Assistant:

void CompilerMSL::analyze_argument_buffers()
{
	// Gather all used resources and sort them out into argument buffers.
	// Each argument buffer corresponds to a descriptor set in SPIR-V.
	// The [[id(N)]] values used correspond to the resource mapping we have for MSL.
	// Otherwise, the binding number is used, but this is generally not safe some types like
	// combined image samplers and arrays of resources. Metal needs different indices here,
	// while SPIR-V can have one descriptor set binding. To use argument buffers in practice,
	// you will need to use the remapping from the API.
	for (auto &id : argument_buffer_ids)
		id = 0;

	// Output resources, sorted by resource index & type.
	struct Resource
	{
		SPIRVariable *var;
		string name;
		SPIRType::BaseType basetype;
		uint32_t index;
		uint32_t plane;
	};
	SmallVector<Resource> resources_in_set[kMaxArgumentBuffers];
	SmallVector<uint32_t> inline_block_vars;

	bool set_needs_swizzle_buffer[kMaxArgumentBuffers] = {};
	bool set_needs_buffer_sizes[kMaxArgumentBuffers] = {};
	bool needs_buffer_sizes = false;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t self, SPIRVariable &var) {
		if ((var.storage == StorageClassUniform || var.storage == StorageClassUniformConstant ||
		     var.storage == StorageClassStorageBuffer) &&
		    !is_hidden_variable(var))
		{
			uint32_t desc_set = get_decoration(self, DecorationDescriptorSet);
			// Ignore if it's part of a push descriptor set.
			if (!descriptor_set_is_argument_buffer(desc_set))
				return;

			uint32_t var_id = var.self;
			auto &type = get_variable_data_type(var);

			if (desc_set >= kMaxArgumentBuffers)
				SPIRV_CROSS_THROW("Descriptor set index is out of range.");

			const MSLConstexprSampler *constexpr_sampler = nullptr;
			if (type.basetype == SPIRType::SampledImage || type.basetype == SPIRType::Sampler)
			{
				constexpr_sampler = find_constexpr_sampler(var_id);
				if (constexpr_sampler)
				{
					// Mark this ID as a constexpr sampler for later in case it came from set/bindings.
					constexpr_samplers_by_id[var_id] = *constexpr_sampler;
				}
			}

			uint32_t binding = get_decoration(var_id, DecorationBinding);
			if (type.basetype == SPIRType::SampledImage)
			{
				add_resource_name(var_id);

				uint32_t plane_count = 1;
				if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
					plane_count = constexpr_sampler->planes;

				for (uint32_t i = 0; i < plane_count; i++)
				{
					uint32_t image_resource_index = get_metal_resource_index(var, SPIRType::Image, i);
					resources_in_set[desc_set].push_back(
					    { &var, to_name(var_id), SPIRType::Image, image_resource_index, i });
				}

				if (type.image.dim != DimBuffer && !constexpr_sampler)
				{
					uint32_t sampler_resource_index = get_metal_resource_index(var, SPIRType::Sampler);
					resources_in_set[desc_set].push_back(
					    { &var, to_sampler_expression(var_id), SPIRType::Sampler, sampler_resource_index, 0 });
				}
			}
			else if (inline_uniform_blocks.count(SetBindingPair{ desc_set, binding }))
			{
				inline_block_vars.push_back(var_id);
			}
			else if (!constexpr_sampler)
			{
				// constexpr samplers are not declared as resources.
				// Inline uniform blocks are always emitted at the end.
				if (!msl_options.is_ios() || type.basetype != SPIRType::Image || type.image.sampled != 2)
				{
					add_resource_name(var_id);
					resources_in_set[desc_set].push_back(
					    { &var, to_name(var_id), type.basetype, get_metal_resource_index(var, type.basetype), 0 });
				}
			}

			// Check if this descriptor set needs a swizzle buffer.
			if (needs_swizzle_buffer_def && is_sampled_image_type(type))
				set_needs_swizzle_buffer[desc_set] = true;
			else if (buffers_requiring_array_length.count(var_id) != 0)
			{
				set_needs_buffer_sizes[desc_set] = true;
				needs_buffer_sizes = true;
			}
		}
	});

	if (needs_swizzle_buffer_def || needs_buffer_sizes)
	{
		uint32_t uint_ptr_type_id = 0;

		// We might have to add a swizzle buffer resource to the set.
		for (uint32_t desc_set = 0; desc_set < kMaxArgumentBuffers; desc_set++)
		{
			if (!set_needs_swizzle_buffer[desc_set] && !set_needs_buffer_sizes[desc_set])
				continue;

			if (uint_ptr_type_id == 0)
			{
				uint_ptr_type_id = ir.increase_bound_by(1);

				// Create a buffer to hold extra data, including the swizzle constants.
				SPIRType uint_type_pointer = get_uint_type();
				uint_type_pointer.pointer = true;
				uint_type_pointer.pointer_depth = 1;
				uint_type_pointer.parent_type = get_uint_type_id();
				uint_type_pointer.storage = StorageClassUniform;
				set<SPIRType>(uint_ptr_type_id, uint_type_pointer);
				set_decoration(uint_ptr_type_id, DecorationArrayStride, 4);
			}

			if (set_needs_swizzle_buffer[desc_set])
			{
				uint32_t var_id = ir.increase_bound_by(1);
				auto &var = set<SPIRVariable>(var_id, uint_ptr_type_id, StorageClassUniformConstant);
				set_name(var_id, "spvSwizzleConstants");
				set_decoration(var_id, DecorationDescriptorSet, desc_set);
				set_decoration(var_id, DecorationBinding, kSwizzleBufferBinding);
				resources_in_set[desc_set].push_back(
				    { &var, to_name(var_id), SPIRType::UInt, get_metal_resource_index(var, SPIRType::UInt), 0 });
			}

			if (set_needs_buffer_sizes[desc_set])
			{
				uint32_t var_id = ir.increase_bound_by(1);
				auto &var = set<SPIRVariable>(var_id, uint_ptr_type_id, StorageClassUniformConstant);
				set_name(var_id, "spvBufferSizeConstants");
				set_decoration(var_id, DecorationDescriptorSet, desc_set);
				set_decoration(var_id, DecorationBinding, kBufferSizeBufferBinding);
				resources_in_set[desc_set].push_back(
				    { &var, to_name(var_id), SPIRType::UInt, get_metal_resource_index(var, SPIRType::UInt), 0 });
			}
		}
	}

	// Now add inline uniform blocks.
	for (uint32_t var_id : inline_block_vars)
	{
		auto &var = get<SPIRVariable>(var_id);
		uint32_t desc_set = get_decoration(var_id, DecorationDescriptorSet);
		add_resource_name(var_id);
		resources_in_set[desc_set].push_back(
		    { &var, to_name(var_id), SPIRType::Struct, get_metal_resource_index(var, SPIRType::Struct), 0 });
	}

	for (uint32_t desc_set = 0; desc_set < kMaxArgumentBuffers; desc_set++)
	{
		auto &resources = resources_in_set[desc_set];
		if (resources.empty())
			continue;

		assert(descriptor_set_is_argument_buffer(desc_set));

		uint32_t next_id = ir.increase_bound_by(3);
		uint32_t type_id = next_id + 1;
		uint32_t ptr_type_id = next_id + 2;
		argument_buffer_ids[desc_set] = next_id;

		auto &buffer_type = set<SPIRType>(type_id);

		buffer_type.basetype = SPIRType::Struct;

		if ((argument_buffer_device_storage_mask & (1u << desc_set)) != 0)
		{
			buffer_type.storage = StorageClassStorageBuffer;
			// Make sure the argument buffer gets marked as const device.
			set_decoration(next_id, DecorationNonWritable);
			// Need to mark the type as a Block to enable this.
			set_decoration(type_id, DecorationBlock);
		}
		else
			buffer_type.storage = StorageClassUniform;

		set_name(type_id, join("spvDescriptorSetBuffer", desc_set));

		auto &ptr_type = set<SPIRType>(ptr_type_id);
		ptr_type = buffer_type;
		ptr_type.pointer = true;
		ptr_type.pointer_depth = 1;
		ptr_type.parent_type = type_id;

		uint32_t buffer_variable_id = next_id;
		set<SPIRVariable>(buffer_variable_id, ptr_type_id, StorageClassUniform);
		set_name(buffer_variable_id, join("spvDescriptorSet", desc_set));

		// Ids must be emitted in ID order.
		sort(begin(resources), end(resources), [&](const Resource &lhs, const Resource &rhs) -> bool {
			return tie(lhs.index, lhs.basetype) < tie(rhs.index, rhs.basetype);
		});

		uint32_t member_index = 0;
		for (auto &resource : resources)
		{
			auto &var = *resource.var;
			auto &type = get_variable_data_type(var);
			string mbr_name = ensure_valid_name(resource.name, "m");
			if (resource.plane > 0)
				mbr_name += join(plane_name_suffix, resource.plane);
			set_member_name(buffer_type.self, member_index, mbr_name);

			if (resource.basetype == SPIRType::Sampler && type.basetype != SPIRType::Sampler)
			{
				// Have to synthesize a sampler type here.

				bool type_is_array = !type.array.empty();
				uint32_t sampler_type_id = ir.increase_bound_by(type_is_array ? 2 : 1);
				auto &new_sampler_type = set<SPIRType>(sampler_type_id);
				new_sampler_type.basetype = SPIRType::Sampler;
				new_sampler_type.storage = StorageClassUniformConstant;

				if (type_is_array)
				{
					uint32_t sampler_type_array_id = sampler_type_id + 1;
					auto &sampler_type_array = set<SPIRType>(sampler_type_array_id);
					sampler_type_array = new_sampler_type;
					sampler_type_array.array = type.array;
					sampler_type_array.array_size_literal = type.array_size_literal;
					sampler_type_array.parent_type = sampler_type_id;
					buffer_type.member_types.push_back(sampler_type_array_id);
				}
				else
					buffer_type.member_types.push_back(sampler_type_id);
			}
			else
			{
				uint32_t binding = get_decoration(var.self, DecorationBinding);
				SetBindingPair pair = { desc_set, binding };

				if (resource.basetype == SPIRType::Image || resource.basetype == SPIRType::Sampler ||
				    resource.basetype == SPIRType::SampledImage)
				{
					// Drop pointer information when we emit the resources into a struct.
					buffer_type.member_types.push_back(get_variable_data_type_id(var));
					if (resource.plane == 0)
						set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
				else if (buffers_requiring_dynamic_offset.count(pair))
				{
					// Don't set the qualified name here; we'll define a variable holding the corrected buffer address later.
					buffer_type.member_types.push_back(var.basetype);
					buffers_requiring_dynamic_offset[pair].second = var.self;
				}
				else if (inline_uniform_blocks.count(pair))
				{
					// Put the buffer block itself into the argument buffer.
					buffer_type.member_types.push_back(get_variable_data_type_id(var));
					set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
				else
				{
					// Resources will be declared as pointers not references, so automatically dereference as appropriate.
					buffer_type.member_types.push_back(var.basetype);
					if (type.array.empty())
						set_qualified_name(var.self, join("(*", to_name(buffer_variable_id), ".", mbr_name, ")"));
					else
						set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
			}

			set_extended_member_decoration(buffer_type.self, member_index, SPIRVCrossDecorationResourceIndexPrimary,
			                               resource.index);
			set_extended_member_decoration(buffer_type.self, member_index, SPIRVCrossDecorationInterfaceOrigID,
			                               var.self);
			member_index++;
		}
	}
}